

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rhombicCode.cpp
# Opt level: O0

void __thiscall RhombicCode::sweep(RhombicCode *this,string *direction,bool greedy)

{
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_00;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_01;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_02;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_03;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_04;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_05;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_06;
  bool bVar1;
  invalid_argument *piVar2;
  length_error *this_00;
  size_type sVar3;
  reference pvVar4;
  reference piVar5;
  byte in_DL;
  pointer in_RSI;
  long *in_RDI;
  cartesian4 cVar6;
  pair<std::_Rb_tree_const_iterator<int>,_bool> pVar7;
  vstr *in_stack_000000d0;
  string *in_stack_000000d8;
  vstr *in_stack_000000e0;
  undefined4 in_stack_000000e8;
  int in_stack_000000ec;
  RhombicCode *in_stack_000000f0;
  int in_stack_000000fc;
  RhombicCode *in_stack_00000100;
  vstr *in_stack_00000420;
  string *in_stack_00000428;
  vstr *in_stack_00000430;
  iterator it2;
  int edge;
  RhombicCode *in_stack_00000440;
  iterator __end4;
  iterator __begin4;
  value_type *__range4;
  iterator it;
  int imax;
  int i;
  cartesian4 coordinate;
  vstr sweepEdges;
  int vertexIndex;
  iterator __end1;
  iterator __begin1;
  vector<int,_std::allocator<int>_> *__range1;
  vstr edgeDirections;
  set<int,_std::less<int>,_std::allocator<int>_> *in_stack_fffffffffffff6d8;
  undefined7 in_stack_fffffffffffff6e0;
  value_type in_stack_fffffffffffff6e7;
  iterator in_stack_fffffffffffff6e8;
  undefined7 in_stack_fffffffffffff6f0;
  undefined1 in_stack_fffffffffffff6f7;
  undefined4 in_stack_fffffffffffff6f8;
  int in_stack_fffffffffffff6fc;
  iterator in_stack_fffffffffffff700;
  string *in_stack_fffffffffffff738;
  int in_stack_fffffffffffff744;
  Code *in_stack_fffffffffffff748;
  string *local_888;
  string *local_810;
  string *local_798;
  string *local_720;
  string *local_6a8;
  string *local_630;
  string *local_5b8;
  vstr *in_stack_fffffffffffffa90;
  string *in_stack_fffffffffffffa98;
  vstr *in_stack_fffffffffffffaa0;
  int in_stack_fffffffffffffaac;
  RhombicCode *in_stack_fffffffffffffab0;
  RhombicCode *local_540;
  _Self local_4f8;
  _Self local_4f0;
  int local_4e4;
  int *local_4e0;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_4d8;
  reference local_4d0;
  _Base_ptr local_4c8;
  undefined1 local_4c0;
  _Base_ptr local_4b8;
  _Base_ptr local_4b0;
  _Self local_4a8;
  _Self local_4a0;
  int local_494;
  int local_490;
  cartesian4 local_48c;
  undefined4 local_47c;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_478;
  int local_45c;
  int *local_458;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_450;
  long *local_448;
  undefined1 local_43c;
  allocator local_43b;
  allocator local_43a;
  allocator local_439;
  string *local_438;
  string local_430 [32];
  string local_410 [32];
  string local_3f0 [32];
  string *local_3d0;
  undefined8 local_3c8;
  undefined1 local_3bc;
  allocator local_3bb;
  allocator local_3ba;
  allocator local_3b9;
  string *local_3b8;
  string local_3b0 [32];
  string local_390 [32];
  string local_370 [32];
  string *local_350;
  undefined8 local_348;
  undefined1 local_33c;
  allocator local_33b;
  allocator local_33a;
  allocator local_339;
  string *local_338;
  string local_330 [32];
  string local_310 [32];
  string local_2f0 [32];
  string *local_2d0;
  undefined8 local_2c8;
  undefined1 local_2bc;
  allocator local_2bb;
  allocator local_2ba;
  allocator local_2b9;
  string *local_2b8;
  string local_2b0 [32];
  string local_290 [32];
  string local_270 [32];
  string *local_250;
  undefined8 local_248;
  undefined1 local_23c;
  allocator local_23b;
  allocator local_23a;
  allocator local_239;
  string *local_238;
  string local_230 [32];
  string local_210 [32];
  string local_1f0 [32];
  string *local_1d0;
  undefined8 local_1c8;
  undefined1 local_1bc;
  allocator local_1bb;
  allocator local_1ba;
  allocator local_1b9;
  string *local_1b8;
  string local_1b0 [32];
  string local_190 [32];
  string local_170 [32];
  string *local_150;
  undefined8 local_148;
  undefined1 local_13c;
  allocator local_13b;
  allocator local_13a;
  allocator local_139;
  string *local_138;
  string local_130 [32];
  string local_110 [32];
  string local_f0 [32];
  string *local_d0;
  undefined8 local_c8;
  undefined1 local_bc;
  allocator local_bb;
  allocator local_ba;
  allocator local_b9;
  string *local_b8;
  undefined1 local_b0 [64];
  string local_70 [32];
  undefined1 local_50 [63];
  byte local_11;
  pointer local_10;
  
  local_11 = in_DL & 1;
  local_10 = in_RSI;
  Code::clearFlipBits((Code *)CONCAT17(in_stack_fffffffffffff6e7,in_stack_fffffffffffff6e0));
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)0x1408a4);
  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          CONCAT17(in_stack_fffffffffffff6e7,in_stack_fffffffffffff6e0),
                          (char *)in_stack_fffffffffffff6d8);
  if (bVar1) {
    local_bc = 1;
    local_b8 = (string *)local_b0;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)local_b0,"xy",&local_b9);
    local_b8 = (string *)(local_b0 + 0x20);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)(local_b0 + 0x20),"yz",&local_ba);
    local_b8 = local_70;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_70,"xz",&local_bb);
    local_bc = 0;
    local_50._0_8_ = local_b0;
    local_50._8_8_ = (_Base_ptr)0x3;
    __l._M_array._4_4_ = in_stack_fffffffffffff6fc;
    __l._M_array._0_4_ = in_stack_fffffffffffff6f8;
    __l._M_len = (size_type)in_stack_fffffffffffff700._M_node;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator=((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)CONCAT17(in_stack_fffffffffffff6f7,in_stack_fffffffffffff6f0),__l);
    local_540 = (RhombicCode *)local_50;
    do {
      in_stack_fffffffffffffab0 =
           (RhombicCode *)&local_540[-1].super_Code.distDouble0To1._M_param._M_b;
      std::__cxx11::string::~string((string *)in_stack_fffffffffffffab0);
      local_540 = in_stack_fffffffffffffab0;
    } while (in_stack_fffffffffffffab0 != (RhombicCode *)local_b0);
    std::allocator<char>::~allocator((allocator<char> *)&local_bb);
    std::allocator<char>::~allocator((allocator<char> *)&local_ba);
    std::allocator<char>::~allocator((allocator<char> *)&local_b9);
  }
  else {
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            CONCAT17(in_stack_fffffffffffff6e7,in_stack_fffffffffffff6e0),
                            (char *)in_stack_fffffffffffff6d8);
    if (bVar1) {
      local_13c = 1;
      local_138 = local_130;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_130,"xyz",&local_139);
      local_138 = local_110;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_110,"-xz",&local_13a);
      local_138 = local_f0;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_f0,"-yz",&local_13b);
      local_13c = 0;
      local_d0 = local_130;
      local_c8 = 3;
      __l_00._M_array._4_4_ = in_stack_fffffffffffff6fc;
      __l_00._M_array._0_4_ = in_stack_fffffffffffff6f8;
      __l_00._M_len = (size_type)in_stack_fffffffffffff700._M_node;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator=((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)CONCAT17(in_stack_fffffffffffff6f7,in_stack_fffffffffffff6f0),__l_00);
      local_5b8 = (string *)&local_d0;
      do {
        local_5b8 = local_5b8 + -0x20;
        std::__cxx11::string::~string(local_5b8);
      } while (local_5b8 != local_130);
      std::allocator<char>::~allocator((allocator<char> *)&local_13b);
      std::allocator<char>::~allocator((allocator<char> *)&local_13a);
      std::allocator<char>::~allocator((allocator<char> *)&local_139);
    }
    else {
      bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              CONCAT17(in_stack_fffffffffffff6e7,in_stack_fffffffffffff6e0),
                              (char *)in_stack_fffffffffffff6d8);
      if (bVar1) {
        local_1bc = 1;
        local_1b8 = local_1b0;
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_1b0,"xyz",&local_1b9);
        local_1b8 = local_190;
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_190,"-xy",&local_1ba);
        local_1b8 = local_170;
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_170,"-yz",&local_1bb);
        local_1bc = 0;
        local_150 = local_1b0;
        local_148 = 3;
        __l_01._M_array._4_4_ = in_stack_fffffffffffff6fc;
        __l_01._M_array._0_4_ = in_stack_fffffffffffff6f8;
        __l_01._M_len = (size_type)in_stack_fffffffffffff700._M_node;
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::operator=((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)CONCAT17(in_stack_fffffffffffff6f7,in_stack_fffffffffffff6f0),__l_01);
        local_630 = (string *)&local_150;
        do {
          local_630 = local_630 + -0x20;
          std::__cxx11::string::~string(local_630);
        } while (local_630 != local_1b0);
        std::allocator<char>::~allocator((allocator<char> *)&local_1bb);
        std::allocator<char>::~allocator((allocator<char> *)&local_1ba);
        std::allocator<char>::~allocator((allocator<char> *)&local_1b9);
      }
      else {
        bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )CONCAT17(in_stack_fffffffffffff6e7,in_stack_fffffffffffff6e0),
                                (char *)in_stack_fffffffffffff6d8);
        if (bVar1) {
          local_23c = 1;
          local_238 = local_230;
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_230,"xyz",&local_239);
          local_238 = local_210;
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_210,"-xy",&local_23a);
          local_238 = local_1f0;
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_1f0,"-xz",&local_23b);
          local_23c = 0;
          local_1d0 = local_230;
          local_1c8 = 3;
          __l_02._M_array._4_4_ = in_stack_fffffffffffff6fc;
          __l_02._M_array._0_4_ = in_stack_fffffffffffff6f8;
          __l_02._M_len = (size_type)in_stack_fffffffffffff700._M_node;
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::operator=((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)CONCAT17(in_stack_fffffffffffff6f7,in_stack_fffffffffffff6f0),__l_02);
          local_6a8 = (string *)&local_1d0;
          do {
            local_6a8 = local_6a8 + -0x20;
            std::__cxx11::string::~string(local_6a8);
          } while (local_6a8 != local_230);
          std::allocator<char>::~allocator((allocator<char> *)&local_23b);
          std::allocator<char>::~allocator((allocator<char> *)&local_23a);
          std::allocator<char>::~allocator((allocator<char> *)&local_239);
        }
        else {
          bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)CONCAT17(in_stack_fffffffffffff6e7,in_stack_fffffffffffff6e0),
                                  (char *)in_stack_fffffffffffff6d8);
          if (bVar1) {
            local_2bc = 1;
            local_2b8 = local_2b0;
            std::allocator<char>::allocator();
            std::__cxx11::string::string(local_2b0,"-xy",&local_2b9);
            local_2b8 = local_290;
            std::allocator<char>::allocator();
            std::__cxx11::string::string(local_290,"-yz",&local_2ba);
            local_2b8 = local_270;
            std::allocator<char>::allocator();
            std::__cxx11::string::string(local_270,"-xz",&local_2bb);
            local_2bc = 0;
            local_250 = local_2b0;
            local_248 = 3;
            __l_03._M_array._4_4_ = in_stack_fffffffffffff6fc;
            __l_03._M_array._0_4_ = in_stack_fffffffffffff6f8;
            __l_03._M_len = (size_type)in_stack_fffffffffffff700._M_node;
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::operator=((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)CONCAT17(in_stack_fffffffffffff6f7,in_stack_fffffffffffff6f0),__l_03);
            local_720 = (string *)&local_250;
            do {
              local_720 = local_720 + -0x20;
              std::__cxx11::string::~string(local_720);
            } while (local_720 != local_2b0);
            std::allocator<char>::~allocator((allocator<char> *)&local_2bb);
            std::allocator<char>::~allocator((allocator<char> *)&local_2ba);
            std::allocator<char>::~allocator((allocator<char> *)&local_2b9);
          }
          else {
            bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)CONCAT17(in_stack_fffffffffffff6e7,in_stack_fffffffffffff6e0)
                                    ,(char *)in_stack_fffffffffffff6d8);
            if (bVar1) {
              local_33c = 1;
              local_338 = local_330;
              std::allocator<char>::allocator();
              std::__cxx11::string::string(local_330,"-xyz",&local_339);
              local_338 = local_310;
              std::allocator<char>::allocator();
              std::__cxx11::string::string(local_310,"xz",&local_33a);
              local_338 = local_2f0;
              std::allocator<char>::allocator();
              std::__cxx11::string::string(local_2f0,"yz",&local_33b);
              local_33c = 0;
              local_2d0 = local_330;
              local_2c8 = 3;
              __l_04._M_array._4_4_ = in_stack_fffffffffffff6fc;
              __l_04._M_array._0_4_ = in_stack_fffffffffffff6f8;
              __l_04._M_len = (size_type)in_stack_fffffffffffff700._M_node;
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::operator=((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)CONCAT17(in_stack_fffffffffffff6f7,in_stack_fffffffffffff6f0),__l_04);
              local_798 = (string *)&local_2d0;
              do {
                local_798 = local_798 + -0x20;
                std::__cxx11::string::~string(local_798);
              } while (local_798 != local_330);
              std::allocator<char>::~allocator((allocator<char> *)&local_33b);
              std::allocator<char>::~allocator((allocator<char> *)&local_33a);
              std::allocator<char>::~allocator((allocator<char> *)&local_339);
            }
            else {
              bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)CONCAT17(in_stack_fffffffffffff6e7,
                                                  in_stack_fffffffffffff6e0),
                                      (char *)in_stack_fffffffffffff6d8);
              if (bVar1) {
                local_3bc = 1;
                local_3b8 = local_3b0;
                std::allocator<char>::allocator();
                std::__cxx11::string::string(local_3b0,"-xyz",&local_3b9);
                local_3b8 = local_390;
                std::allocator<char>::allocator();
                std::__cxx11::string::string(local_390,"xy",&local_3ba);
                local_3b8 = local_370;
                std::allocator<char>::allocator();
                std::__cxx11::string::string(local_370,"yz",&local_3bb);
                local_3bc = 0;
                local_350 = local_3b0;
                local_348 = 3;
                __l_05._M_array._4_4_ = in_stack_fffffffffffff6fc;
                __l_05._M_array._0_4_ = in_stack_fffffffffffff6f8;
                __l_05._M_len = (size_type)in_stack_fffffffffffff700._M_node;
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::operator=((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)CONCAT17(in_stack_fffffffffffff6f7,in_stack_fffffffffffff6f0),__l_05)
                ;
                local_810 = (string *)&local_350;
                do {
                  local_810 = local_810 + -0x20;
                  std::__cxx11::string::~string(local_810);
                } while (local_810 != local_3b0);
                std::allocator<char>::~allocator((allocator<char> *)&local_3bb);
                std::allocator<char>::~allocator((allocator<char> *)&local_3ba);
                std::allocator<char>::~allocator((allocator<char> *)&local_3b9);
              }
              else {
                bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)CONCAT17(in_stack_fffffffffffff6e7,
                                                    in_stack_fffffffffffff6e0),
                                        (char *)in_stack_fffffffffffff6d8);
                if (!bVar1) {
                  piVar2 = (invalid_argument *)__cxa_allocate_exception(0x10);
                  std::invalid_argument::invalid_argument(piVar2,"Invalid sweep direction.");
                  __cxa_throw(piVar2,&std::invalid_argument::typeinfo,
                              std::invalid_argument::~invalid_argument);
                }
                local_43c = 1;
                local_438 = local_430;
                std::allocator<char>::allocator();
                std::__cxx11::string::string(local_430,"-xyz",&local_439);
                local_438 = local_410;
                std::allocator<char>::allocator();
                std::__cxx11::string::string(local_410,"xy",&local_43a);
                local_438 = local_3f0;
                std::allocator<char>::allocator();
                std::__cxx11::string::string(local_3f0,"xz",&local_43b);
                local_43c = 0;
                local_3d0 = local_430;
                local_3c8 = 3;
                __l_06._M_array._4_4_ = in_stack_fffffffffffff6fc;
                __l_06._M_array._0_4_ = in_stack_fffffffffffff6f8;
                __l_06._M_len = (size_type)in_stack_fffffffffffff700._M_node;
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::operator=((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)CONCAT17(in_stack_fffffffffffff6f7,in_stack_fffffffffffff6f0),__l_06)
                ;
                local_888 = (string *)&local_3d0;
                do {
                  local_888 = local_888 + -0x20;
                  std::__cxx11::string::~string(local_888);
                } while (local_888 != local_430);
                std::allocator<char>::~allocator((allocator<char> *)&local_43b);
                std::allocator<char>::~allocator((allocator<char> *)&local_43a);
                std::allocator<char>::~allocator((allocator<char> *)&local_439);
              }
            }
          }
        }
      }
    }
  }
  local_448 = in_RDI + 0x10;
  local_450._M_current =
       (int *)std::vector<int,_std::allocator<int>_>::begin
                        ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff6d8);
  local_458 = (int *)std::vector<int,_std::allocator<int>_>::end
                               ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff6d8);
  do {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                       CONCAT17(in_stack_fffffffffffff6e7,in_stack_fffffffffffff6e0),
                       (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                       in_stack_fffffffffffff6d8);
    if (!bVar1) {
      local_490 = 0;
      sVar3 = std::vector<signed_char,_std::allocator<signed_char>_>::size
                        ((vector<signed_char,_std::allocator<signed_char>_> *)(in_RDI + 6));
      local_494 = (int)sVar3;
      do {
        if (local_494 <= local_490) {
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)CONCAT17(in_stack_fffffffffffff6f7,in_stack_fffffffffffff6f0));
          return;
        }
        pvVar4 = std::vector<signed_char,_std::allocator<signed_char>_>::operator[]
                           ((vector<signed_char,_std::allocator<signed_char>_> *)(in_RDI + 6),
                            (long)local_490);
        if (*pvVar4 != '\0') {
          local_4a0._M_node =
               (_Base_ptr)
               std::set<int,_std::less<int>,_std::allocator<int>_>::find
                         (in_stack_fffffffffffff6e8._M_node,
                          (key_type *)CONCAT17(in_stack_fffffffffffff6e7,in_stack_fffffffffffff6e0))
          ;
          local_4a8._M_node =
               (_Base_ptr)
               std::set<int,_std::less<int>,_std::allocator<int>_>::end(in_stack_fffffffffffff6d8);
          bVar1 = std::operator!=(&local_4a0,&local_4a8);
          if (bVar1) {
            local_4b0 = local_4a0._M_node;
            in_stack_fffffffffffff700 =
                 std::set<int,std::less<int>,std::allocator<int>>::erase_abi_cxx11_
                           ((set<int,_std::less<int>,_std::allocator<int>_> *)
                            CONCAT17(in_stack_fffffffffffff6e7,in_stack_fffffffffffff6e0),
                            in_stack_fffffffffffff6e8._M_node);
            local_4b8 = in_stack_fffffffffffff700._M_node;
          }
          else {
            pVar7 = std::set<int,_std::less<int>,_std::allocator<int>_>::insert
                              ((set<int,_std::less<int>,_std::allocator<int>_> *)
                               in_stack_fffffffffffff700._M_node,
                               (value_type_conflict1 *)
                               CONCAT44(in_stack_fffffffffffff6fc,in_stack_fffffffffffff6f8));
            local_4c8 = (_Base_ptr)pVar7.first._M_node;
            in_stack_fffffffffffff6f7 = pVar7.second;
            in_stack_fffffffffffff6f8 = pVar7.first._M_node._0_4_;
            in_stack_fffffffffffff6fc = pVar7.first._M_node._4_4_;
            local_4c0 = in_stack_fffffffffffff6f7;
          }
          if (1 < *(int *)((long)in_RDI + 0x13c)) {
            local_4d0 = std::
                        vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                        ::operator[]((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                      *)(in_RDI + 0x19),(long)local_490);
            local_4d8._M_current =
                 (int *)std::vector<int,_std::allocator<int>_>::begin
                                  ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff6d8);
            local_4e0 = (int *)std::vector<int,_std::allocator<int>_>::end
                                         ((vector<int,_std::allocator<int>_> *)
                                          in_stack_fffffffffffff6d8);
            while( true ) {
              bVar1 = __gnu_cxx::operator!=
                                ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>
                                  *)CONCAT17(in_stack_fffffffffffff6e7,in_stack_fffffffffffff6e0),
                                 (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>
                                  *)in_stack_fffffffffffff6d8);
              if (!bVar1) break;
              piVar5 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>
                       ::operator*(&local_4d8);
              local_4e4 = *piVar5;
              if ((*(byte *)(in_RDI + 0x27) & 1) == 0) {
LAB_001427e4:
                pvVar4 = std::vector<signed_char,_std::allocator<signed_char>_>::operator[]
                                   ((vector<signed_char,_std::allocator<signed_char>_> *)
                                    (in_RDI + 3),(long)local_4e4);
                in_stack_fffffffffffff6e7 = (value_type)((*pvVar4 + 1) % 2);
                pvVar4 = std::vector<signed_char,_std::allocator<signed_char>_>::operator[]
                                   ((vector<signed_char,_std::allocator<signed_char>_> *)
                                    (in_RDI + 3),(long)local_4e4);
                *pvVar4 = in_stack_fffffffffffff6e7;
              }
              else {
                in_stack_fffffffffffff6e8 =
                     std::set<int,_std::less<int>,_std::allocator<int>_>::find
                               (in_stack_fffffffffffff6e8._M_node,
                                (key_type *)
                                CONCAT17(in_stack_fffffffffffff6e7,in_stack_fffffffffffff6e0));
                local_4f0._M_node = in_stack_fffffffffffff6e8._M_node;
                local_4f8._M_node =
                     (_Base_ptr)
                     std::set<int,_std::less<int>,_std::allocator<int>_>::end
                               (in_stack_fffffffffffff6d8);
                bVar1 = std::operator==(&local_4f0,&local_4f8);
                if (!bVar1) goto LAB_001427e4;
              }
              __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
              operator++(&local_4d8);
            }
          }
        }
        local_490 = local_490 + 1;
      } while( true );
    }
    piVar5 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator*
                       (&local_450);
    local_45c = *piVar5;
    if ((local_11 & 1) == 0) {
      bVar1 = Code::checkExtremalVertex
                        (in_stack_fffffffffffff748,in_stack_fffffffffffff744,
                         in_stack_fffffffffffff738);
      if (bVar1) goto LAB_0014226a;
    }
    else {
LAB_0014226a:
      (**(code **)(*in_RDI + 0x18))(&local_478,in_RDI,local_45c,local_10);
      sVar3 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::size(&local_478);
      if (4 < sVar3) {
        this_00 = (length_error *)__cxa_allocate_exception(0x10);
        std::length_error::length_error
                  (this_00,"More than four up-edges found for a rhombic lattice vertex.");
        __cxa_throw(this_00,&std::length_error::typeinfo,std::length_error::~length_error);
      }
      sVar3 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::size(&local_478);
      if (sVar3 == 0) {
        local_47c = 3;
      }
      else {
        std::unique_ptr<Lattice,_std::default_delete<Lattice>_>::operator->
                  ((unique_ptr<Lattice,_std::default_delete<Lattice>_> *)0x142357);
        cVar6 = Lattice::indexToCoordinate
                          ((Lattice *)in_stack_fffffffffffff700._M_node,in_stack_fffffffffffff6fc);
        local_48c = cVar6;
        sVar3 = std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::size(&local_478);
        if ((sVar3 == 1) && ((*(byte *)(in_RDI + 0x27) & 1) == 0)) {
          local_47c = 3;
        }
        else {
          if (local_48c.w == 0) {
            if ((local_48c.x + local_48c.y + local_48c.z) % 2 != (int)in_RDI[0x3a]) {
              piVar2 = (invalid_argument *)__cxa_allocate_exception(0x10);
              std::invalid_argument::invalid_argument
                        (piVar2,"Vertex not present in lattice has up-edges.");
              __cxa_throw(piVar2,&std::invalid_argument::typeinfo,
                          std::invalid_argument::~invalid_argument);
            }
            if ((*(byte *)(in_RDI + 0x27) & 1) == 0) {
              sweepFullVertex(in_stack_00000440,it2._M_node._4_4_,in_stack_00000430,
                              in_stack_00000428,in_stack_00000420);
            }
            else {
              sweepFullVertexBoundary
                        (in_stack_000000f0,in_stack_000000ec,in_stack_000000e0,in_stack_000000d8,
                         in_stack_000000d0);
            }
          }
          else if ((*(byte *)(in_RDI + 0x27) & 1) == 0) {
            sweepHalfVertex(in_stack_fffffffffffffab0,in_stack_fffffffffffffaac,
                            in_stack_fffffffffffffaa0,in_stack_fffffffffffffa98,
                            in_stack_fffffffffffffa90);
          }
          else {
            sweepHalfVertexBoundary
                      (in_stack_00000100,in_stack_000000fc,(vstr *)in_stack_000000f0,
                       (string *)CONCAT44(in_stack_000000ec,in_stack_000000e8),in_stack_000000e0);
          }
          local_47c = 0;
        }
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)CONCAT17(in_stack_fffffffffffff6f7,in_stack_fffffffffffff6f0));
    }
    __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
              (&local_450);
  } while( true );
}

Assistant:

void RhombicCode::sweep(const std::string &direction, bool greedy)
{
    clearFlipBits();
    vstr edgeDirections;
    if (direction == "xyz")
    {
        edgeDirections = {"xy", "yz", "xz"};
    }
    else if (direction == "xy")
    {
        edgeDirections = {"xyz", "-xz", "-yz"};
    }
    else if (direction == "xz")
    {
        edgeDirections = {"xyz", "-xy", "-yz"};
    }
    else if (direction == "yz")
    {
        edgeDirections = {"xyz", "-xy", "-xz"};
    }
    else if (direction == "-xyz")
    {
        edgeDirections = {"-xy", "-yz", "-xz"};
    }
    else if (direction == "-xy")
    {
        edgeDirections = {"-xyz", "xz", "yz"};
    }
    else if (direction == "-xz")
    {
        edgeDirections = {"-xyz", "xy", "yz"};
    }
    else if (direction == "-yz")
    {
        edgeDirections = {"-xyz", "xy", "xz"};
    }
    else
    {
        throw std::invalid_argument("Invalid sweep direction.");
    }
    // for (int vertexIndex = 0; vertexIndex < 2 * pow(l, 3); ++vertexIndex)
    for (auto const vertexIndex : sweepIndices)
    {
        if (!greedy)
        {
            if (!checkExtremalVertex(vertexIndex, direction))
            {
                continue;
            }
        }
        // std::cout << "Trying to find sweep edges... ";
        vstr sweepEdges = findSweepEdges(vertexIndex, direction);
        // if (sweepEdges.size() > 0)
        // {
        //     std::cerr << "Vertex = " << lattice->indexToCoordinate(vertexIndex) << std::endl;
        //     for (auto &e : sweepEdges)
        //     {
        //         std::cerr << e << std::endl;
        //     }
        // }
        // std::cout << "FOUND." << std::endl;
        if (sweepEdges.size() > 4)
        {
            throw std::length_error("More than four up-edges found for a rhombic lattice vertex.");
        }
        if (sweepEdges.size() == 0)
        {
            continue;
        }
        cartesian4 coordinate = lattice->indexToCoordinate(vertexIndex);
        // if (sweepEdges.size() == 1 && (!boundaries || coordinate.w == 0))
        if (sweepEdges.size() == 1 && !boundaries)
        {
            continue;
        }
        if (coordinate.w == 0)
        {
            if ((coordinate.x + coordinate.y + coordinate.z) % 2 == latticeParity)
            {
                if (boundaries)
                {
                    sweepFullVertexBoundary(vertexIndex, sweepEdges, direction, edgeDirections);
                }
                else
                {
                    sweepFullVertex(vertexIndex, sweepEdges, direction, edgeDirections);
                }
            }
            else
            {
                throw std::invalid_argument("Vertex not present in lattice has up-edges.");
            }
        }
        else
        {
            if (boundaries)
            {
                sweepHalfVertexBoundary(vertexIndex, sweepEdges, direction, edgeDirections);
            }
            else
            {
                sweepHalfVertex(vertexIndex, sweepEdges, direction, edgeDirections);
            }
        }
    }
    for (int i = 0, imax = flipBits.size(); i < imax; ++i)
    {
        if (flipBits[i])
        {
            auto it = error.find(i);
            if (it != error.end())
            {
                error.erase(it);
            }
            else
            {
                error.insert(i);
            }
            if (sweepRate > 1)
            {
                for (const int edge : faceToEdges[i])
                {
                    // std::cerr << edge << std::endl;
                    if (boundaries)
                    {
                        auto it2 = syndromeIndices.find(edge);
                        if (it2 == syndromeIndices.end())
                        {
                            continue;
                        }
                    }
                    syndrome[edge] = (syndrome[edge] + 1) % 2;
                }
            }
        }
    }
}